

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

char * nng_stat_name(nng_stat *stat)

{
  return stat->s_info->si_name;
}

Assistant:

const char *
nng_stat_name(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_info->si_name);
#else
	NNI_ARG_UNUSED(stat);
	return (NULL);
#endif
}